

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_poll.c
# Opt level: O3

int main(void)

{
  int iVar1;
  char *pcVar2;
  tnt_stream *ptVar3;
  tnt_reply *r;
  ulong uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined8 local_40c8 [2048];
  char acStack_c8 [8];
  char uri [128];
  
  plan(1);
  plan(1);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  bVar7 = false;
  fprintf(_stdout,"*** %s: prep ***","test_poll");
  fputc(10,_stdout);
  uri[0x68] = '\0';
  uri[0x69] = '\0';
  uri[0x6a] = '\0';
  uri[0x6b] = '\0';
  uri[0x6c] = '\0';
  uri[0x6d] = '\0';
  uri[0x6e] = '\0';
  uri[0x6f] = '\0';
  uri[0x70] = '\0';
  uri[0x71] = '\0';
  uri[0x72] = '\0';
  uri[0x73] = '\0';
  uri[0x74] = '\0';
  uri[0x75] = '\0';
  uri[0x76] = '\0';
  uri[0x77] = '\0';
  uri[0x58] = '\0';
  uri[0x59] = '\0';
  uri[0x5a] = '\0';
  uri[0x5b] = '\0';
  uri[0x5c] = '\0';
  uri[0x5d] = '\0';
  uri[0x5e] = '\0';
  uri[0x5f] = '\0';
  uri[0x60] = '\0';
  uri[0x61] = '\0';
  uri[0x62] = '\0';
  uri[99] = '\0';
  uri[100] = '\0';
  uri[0x65] = '\0';
  uri[0x66] = '\0';
  uri[0x67] = '\0';
  uri[0x48] = '\0';
  uri[0x49] = '\0';
  uri[0x4a] = '\0';
  uri[0x4b] = '\0';
  uri[0x4c] = '\0';
  uri[0x4d] = '\0';
  uri[0x4e] = '\0';
  uri[0x4f] = '\0';
  uri[0x50] = '\0';
  uri[0x51] = '\0';
  uri[0x52] = '\0';
  uri[0x53] = '\0';
  uri[0x54] = '\0';
  uri[0x55] = '\0';
  uri[0x56] = '\0';
  uri[0x57] = '\0';
  uri[0x38] = '\0';
  uri[0x39] = '\0';
  uri[0x3a] = '\0';
  uri[0x3b] = '\0';
  uri[0x3c] = '\0';
  uri[0x3d] = '\0';
  uri[0x3e] = '\0';
  uri[0x3f] = '\0';
  uri[0x40] = '\0';
  uri[0x41] = '\0';
  uri[0x42] = '\0';
  uri[0x43] = '\0';
  uri[0x44] = '\0';
  uri[0x45] = '\0';
  uri[0x46] = '\0';
  uri[0x47] = '\0';
  uri[0x28] = '\0';
  uri[0x29] = '\0';
  uri[0x2a] = '\0';
  uri[0x2b] = '\0';
  uri[0x2c] = '\0';
  uri[0x2d] = '\0';
  uri[0x2e] = '\0';
  uri[0x2f] = '\0';
  uri[0x30] = '\0';
  uri[0x31] = '\0';
  uri[0x32] = '\0';
  uri[0x33] = '\0';
  uri[0x34] = '\0';
  uri[0x35] = '\0';
  uri[0x36] = '\0';
  uri[0x37] = '\0';
  uri[0x18] = '\0';
  uri[0x19] = '\0';
  uri[0x1a] = '\0';
  uri[0x1b] = '\0';
  uri[0x1c] = '\0';
  uri[0x1d] = '\0';
  uri[0x1e] = '\0';
  uri[0x1f] = '\0';
  uri[0x20] = '\0';
  uri[0x21] = '\0';
  uri[0x22] = '\0';
  uri[0x23] = '\0';
  uri[0x24] = '\0';
  uri[0x25] = '\0';
  uri[0x26] = '\0';
  uri[0x27] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  uri[0x14] = '\0';
  uri[0x15] = '\0';
  uri[0x16] = '\0';
  uri[0x17] = '\0';
  acStack_c8[0] = '\0';
  acStack_c8[1] = '\0';
  acStack_c8[2] = '\0';
  acStack_c8[3] = '\0';
  acStack_c8[4] = '\0';
  acStack_c8[5] = '\0';
  acStack_c8[6] = '\0';
  acStack_c8[7] = '\0';
  uri[0] = '\0';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  pcVar2 = getenv("LISTEN");
  snprintf(acStack_c8,0x80,"test:test@%s",pcVar2);
  memset(local_40c8,0,0x4000);
  uVar4 = 0;
  do {
    ptVar3 = tnt_net((tnt_stream *)0x0);
    if (ptVar3 == (tnt_stream *)0x0) {
      __assert_fail("tnt != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_poll.c"
                    ,0x26,"int test_poll()");
    }
    iVar1 = tnt_set(ptVar3,0,acStack_c8);
    if (iVar1 != 0) {
      main_cold_1();
LAB_00104f28:
      uVar4 = (ulong)((int)uVar4 - 1);
      goto LAB_00104f2b;
    }
    iVar1 = tnt_set(ptVar3,7,0);
    if (iVar1 != 0) {
      main_cold_2();
      goto LAB_00104f28;
    }
    iVar1 = tnt_set(ptVar3,10,0);
    if (iVar1 != 0) {
      main_cold_3();
      goto LAB_00104f28;
    }
    uri[0x78] = '\n';
    uri[0x79] = '\0';
    uri[0x7a] = '\0';
    uri[0x7b] = '\0';
    uri[0x7c] = '\0';
    uri[0x7d] = '\0';
    uri[0x7e] = '\0';
    uri[0x7f] = '\0';
    iVar1 = tnt_set(ptVar3,1,uri + 0x78);
    if (iVar1 != 0) {
      main_cold_4();
      goto LAB_00104f28;
    }
    iVar1 = tnt_connect(ptVar3);
    if (iVar1 != 0) {
      main_cold_5();
      goto LAB_00104f28;
    }
    local_40c8[uVar4] = ptVar3;
    tnt_ping(ptVar3);
    tnt_flush(ptVar3);
    r = tnt_reply_init((tnt_reply *)0x0);
    iVar1 = (*ptVar3->read_reply)(ptVar3,r);
    if (iVar1 != 0) {
      fwrite("failed to read reply\n",0x15,1,_stderr);
      goto LAB_00104f2b;
    }
    tnt_reply_free(r);
    bVar7 = 0x7fe < uVar4;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x800);
  uVar4 = 0x7ff;
  bVar7 = true;
LAB_00104f2b:
  iVar1 = __ok(bVar7,"expected non-assert test");
  if (iVar1 == 0) {
    main_cold_6();
  }
  if (-1 < (int)uVar4) {
    lVar5 = (uVar4 & 0xffffffff) + 1;
    do {
      ptVar3 = (tnt_stream *)local_40c8[lVar5 + -1];
      if (ptVar3 != (tnt_stream *)0x0) {
        tnt_close(ptVar3);
        tnt_stream_free(ptVar3);
      }
      lVar6 = lVar5 + -1;
      bVar7 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar7);
  }
  check_plan();
  return 0;
}

Assistant:

int main()
{
	plan(1);

	test_poll();

	return 0;
}